

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O2

void __thiscall
glslang::HlslParseContext::variableCheck(HlslParseContext *this,TIntermTyped **nodePtr)

{
  TIntermediate *this_00;
  int iVar1;
  undefined4 extraout_var;
  long *plVar3;
  size_t s;
  long lVar4;
  TVariable *this_01;
  TString *name;
  TSourceLoc *loc;
  TIntermSymbol *pTVar5;
  TType local_c8;
  long *plVar2;
  
  iVar1 = (*((*nodePtr)->super_TIntermNode)._vptr_TIntermNode[0xc])();
  plVar2 = (long *)CONCAT44(extraout_var,iVar1);
  if (plVar2 != (long *)0x0) {
    plVar3 = (long *)(**(code **)(*plVar2 + 0xf0))(plVar2);
    iVar1 = (**(code **)(*plVar3 + 0x38))(plVar3);
    if (iVar1 == 0) {
      s = (**(code **)*plVar2)(plVar2);
      lVar4 = (**(code **)(*plVar2 + 400))(plVar2);
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,s,"undeclared identifier",*(undefined8 *)(lVar4 + 8));
      lVar4 = (**(code **)(*plVar2 + 400))(plVar2);
      if (*(long *)(lVar4 + 0x10) != 0) {
        this_01 = (TVariable *)TSymbol::operator_new((TSymbol *)0xf8,s);
        name = (TString *)(**(code **)(*plVar2 + 400))(plVar2);
        TType::TType(&local_c8,EbtFloat,EvqTemporary,1,0,0,false);
        TVariable::TVariable(this_01,name,&local_c8,false);
        TSymbolTable::insert((this->super_TParseContextBase).symbolTable,(TSymbol *)this_01);
        this_00 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        loc = (TSourceLoc *)(**(code **)*plVar2)(plVar2);
        pTVar5 = TIntermediate::addSymbol(this_00,this_01,loc);
        *nodePtr = &pTVar5->super_TIntermTyped;
      }
    }
  }
  return;
}

Assistant:

void HlslParseContext::variableCheck(TIntermTyped*& nodePtr)
{
    TIntermSymbol* symbol = nodePtr->getAsSymbolNode();
    if (! symbol)
        return;

    if (symbol->getType().getBasicType() == EbtVoid) {
        error(symbol->getLoc(), "undeclared identifier", symbol->getName().c_str(), "");

        // Add to symbol table to prevent future error messages on the same name
        if (symbol->getName().size() > 0) {
            TVariable* fakeVariable = new TVariable(&symbol->getName(), TType(EbtFloat));
            symbolTable.insert(*fakeVariable);

            // substitute a symbol node for this new variable
            nodePtr = intermediate.addSymbol(*fakeVariable, symbol->getLoc());
        }
    }
}